

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::TraceDependencies(cmGeneratorTarget *this)

{
  TargetType TVar1;
  cmTargetTraceDependencies tracer;
  cmTargetTraceDependencies local_100;
  
  TVar1 = GetType(this);
  if (TVar1 != GLOBAL_TARGET) {
    cmTargetTraceDependencies::cmTargetTraceDependencies(&local_100,this);
    cmTargetTraceDependencies::Trace(&local_100);
    cmTargetTraceDependencies::~cmTargetTraceDependencies(&local_100);
  }
  return;
}

Assistant:

void cmGeneratorTarget::TraceDependencies()
{
  // CMake-generated targets have no dependencies to trace.  Normally tracing
  // would find nothing anyway, but when building CMake itself the "install"
  // target command ends up referencing the "cmake" target but we do not
  // really want the dependency because "install" depend on "all" anyway.
  if (this->GetType() == cmStateEnums::GLOBAL_TARGET) {
    return;
  }

  // Use a helper object to trace the dependencies.
  cmTargetTraceDependencies tracer(this);
  tracer.Trace();
}